

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprites.cpp
# Opt level: O2

bool __thiscall Amiga::Sprite::advance_dma(Sprite *this,int offset,int y,bool is_first_line)

{
  undefined1 *puVar1;
  uint16_t value;
  bool bVar2;
  
  if (1 < (uint)offset) {
    __assert_fail("offset == 0 || offset == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Sprites.cpp"
                  ,0x44,"bool Amiga::Sprite::advance_dma(int, int, bool)");
  }
  value = (this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_
          [(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_mask_ &
           *(uint *)&(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14];
  if ((uint)this->v_stop_ == y || is_first_line) {
    if (offset == 0) {
      set_start_position(this,value);
    }
    else {
      set_stop_and_control(this,value);
    }
  }
  else {
    bVar2 = (bool)((uint)this->v_start_ == y | this->visible);
    this->visible = bVar2;
    if (bVar2 == false) {
      return false;
    }
    this->data[(uint)-(offset + -1)] = value;
    this->visible = (bool)(bVar2 | offset + -1 == 0);
  }
  puVar1 = &(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  return true;
}

Assistant:

bool Sprite::advance_dma(int offset, int y, bool is_first_line) {
	assert(offset == 0 || offset == 1);

	// Determine which word would be fetched, if DMA occurs.
	// A bit of a cheat.
	const uint16_t next_word = ram_[pointer_[0] & ram_mask_];

	// "When the vertical position of the beam counter is equal to the VSTOP
	// value in the sprite control words, the next two words fetched from the
	// sprite data structure are written into the sprite control registers
	// instead of being sent to the color registers"
	//
	// Guesswork, primarily from observing Spindizzy Worlds: the first line after
	// vertical blank also triggers a control reload. Seek to verify.
	if(y == v_stop_ || is_first_line) {
		if(offset) {
			// Second control word: stop position (mostly).
			set_stop_and_control(next_word);
		} else {
			// First control word: start position.
			set_start_position(next_word);
		}
	} else {
		visible |= y == v_start_;
		if(!visible) return false;	// Act as if there wasn't a fetch.

		// Write colour word 1, then colour word 0; 0 is the word that 'arms'
		// the sprite (i.e. makes it visible).
		set_image_data(1 - offset, next_word);
	}

	// Acknowledge the fetch.
	++pointer_[0];
	return true;
}